

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

tmsize_t TIFFWriteEncodedStrip(TIFF *tif,uint32_t strip,void *data,tmsize_t cc)

{
  uint16_t uVar1;
  int iVar2;
  uint local_40;
  uint16_t sample;
  TIFFDirectory *td;
  tmsize_t cc_local;
  void *data_local;
  uint32_t strip_local;
  TIFF *tif_local;
  
  if (((tif->tif_flags & 0x40) == 0) &&
     (iVar2 = TIFFWriteCheck(tif,0,"TIFFWriteEncodedStrip"), iVar2 == 0)) {
    return -1;
  }
  if ((tif->tif_dir).td_nstrips <= strip) {
    if ((tif->tif_dir).td_planarconfig == 2) {
      TIFFErrorExtR(tif,"TIFFWriteEncodedStrip",
                    "Can not grow image by strips when using separate planes");
      return -1;
    }
    iVar2 = TIFFGrowStrips(tif,1,"TIFFWriteEncodedStrip");
    if (iVar2 == 0) {
      return -1;
    }
    if ((tif->tif_dir).td_imagelength < -((tif->tif_dir).td_rowsperstrip - 1) - 1) {
      local_40 = ((tif->tif_dir).td_imagelength + ((tif->tif_dir).td_rowsperstrip - 1)) /
                 (tif->tif_dir).td_rowsperstrip;
    }
    else {
      local_40 = 0;
    }
    (tif->tif_dir).td_stripsperimage = local_40;
  }
  if ((((tif->tif_flags & 0x10) == 0) || (tif->tif_rawdata == (uint8_t *)0x0)) &&
     (iVar2 = TIFFWriteBufferSetup(tif,(void *)0x0,-1), iVar2 == 0)) {
    tif_local = (TIFF *)0xffffffffffffffff;
  }
  else {
    tif->tif_flags = tif->tif_flags | 0x100000;
    tif->tif_curstrip = strip;
    tif->tif_curoff = 0;
    iVar2 = _TIFFReserveLargeEnoughWriteBuffer(tif,strip);
    if (iVar2 == 0) {
      tif_local = (TIFF *)0xffffffffffffffff;
    }
    else {
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      if ((tif->tif_dir).td_stripsperimage == 0) {
        TIFFErrorExtR(tif,"TIFFWriteEncodedStrip","Zero strips per image");
        tif_local = (TIFF *)0xffffffffffffffff;
      }
      else {
        tif->tif_row = (strip % (tif->tif_dir).td_stripsperimage) * (tif->tif_dir).td_rowsperstrip;
        if ((tif->tif_flags & 0x20) == 0) {
          iVar2 = (*tif->tif_setupencode)(tif);
          if (iVar2 == 0) {
            return -1;
          }
          tif->tif_flags = tif->tif_flags | 0x20;
        }
        tif->tif_flags = tif->tif_flags & 0xffffefff;
        tif_local = (TIFF *)cc;
        if ((tif->tif_dir).td_compression == 1) {
          (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
          if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
             ((tif->tif_flags & 0x100) == 0)) {
            TIFFReverseBits((uint8_t *)data,cc);
          }
          if ((0 < cc) && (iVar2 = TIFFAppendToStrip(tif,strip,(uint8_t *)data,cc), iVar2 == 0)) {
            tif_local = (TIFF *)0xffffffffffffffff;
          }
        }
        else {
          uVar1 = (uint16_t)(strip / (tif->tif_dir).td_stripsperimage);
          iVar2 = (*tif->tif_preencode)(tif,uVar1);
          if (iVar2 == 0) {
            tif_local = (TIFF *)0xffffffffffffffff;
          }
          else {
            (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
            iVar2 = (*tif->tif_encodestrip)(tif,(uint8_t *)data,cc,uVar1);
            if (iVar2 == 0) {
              tif_local = (TIFF *)0xffffffffffffffff;
            }
            else {
              iVar2 = (*tif->tif_postencode)(tif);
              if (iVar2 == 0) {
                tif_local = (TIFF *)0xffffffffffffffff;
              }
              else {
                if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
                   ((tif->tif_flags & 0x100) == 0)) {
                  TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
                }
                if ((tif->tif_rawcc < 1) ||
                   (iVar2 = TIFFAppendToStrip(tif,strip,tif->tif_rawdata,tif->tif_rawcc), iVar2 != 0
                   )) {
                  tif->tif_rawcc = 0;
                  tif->tif_rawcp = tif->tif_rawdata;
                }
                else {
                  tif_local = (TIFF *)0xffffffffffffffff;
                }
              }
            }
          }
        }
      }
    }
  }
  return (tmsize_t)tif_local;
}

Assistant:

tmsize_t TIFFWriteEncodedStrip(TIFF *tif, uint32_t strip, void *data,
                               tmsize_t cc)
{
    static const char module[] = "TIFFWriteEncodedStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint16_t sample;

    if (!WRITECHECKSTRIPS(tif, module))
        return ((tmsize_t)-1);
    /*
     * Check strip array to make sure there's space.
     * We don't support dynamically growing files that
     * have data organized in separate bitplanes because
     * it's too painful.  In that case we require that
     * the imagelength be set properly before the first
     * write (so that the strips array will be fully
     * allocated above).
     */
    if (strip >= td->td_nstrips)
    {
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        {
            TIFFErrorExtR(
                tif, module,
                "Can not grow image by strips when using separate planes");
            return ((tmsize_t)-1);
        }
        if (!TIFFGrowStrips(tif, 1, module))
            return ((tmsize_t)-1);
        td->td_stripsperimage =
            TIFFhowmany_32(td->td_imagelength, td->td_rowsperstrip);
    }
    /*
     * Handle delayed allocation of data buffer.  This
     * permits it to be sized according to the directory
     * info.
     */
    if (!BUFFERCHECK(tif))
        return ((tmsize_t)-1);

    tif->tif_flags |= TIFF_BUF4WRITE;

    tif->tif_curstrip = strip;

    /* this informs TIFFAppendToStrip() we have changed or reset strip */
    tif->tif_curoff = 0;

    if (!_TIFFReserveLargeEnoughWriteBuffer(tif, strip))
    {
        return ((tmsize_t)(-1));
    }

    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;

    if (td->td_stripsperimage == 0)
    {
        TIFFErrorExtR(tif, module, "Zero strips per image");
        return ((tmsize_t)-1);
    }

    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupencode)(tif))
            return ((tmsize_t)-1);
        tif->tif_flags |= TIFF_CODERSETUP;
    }

    tif->tif_flags &= ~TIFF_POSTENCODE;

    /* shortcut to avoid an extra memcpy() */
    if (td->td_compression == COMPRESSION_NONE)
    {
        /* swab if needed - note that source buffer will be altered */
        tif->tif_postdecode(tif, (uint8_t *)data, cc);

        if (!isFillOrder(tif, td->td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)data, cc);

        if (cc > 0 && !TIFFAppendToStrip(tif, strip, (uint8_t *)data, cc))
            return ((tmsize_t)-1);
        return (cc);
    }

    sample = (uint16_t)(strip / td->td_stripsperimage);
    if (!(*tif->tif_preencode)(tif, sample))
        return ((tmsize_t)-1);

    /* swab if needed - note that source buffer will be altered */
    tif->tif_postdecode(tif, (uint8_t *)data, cc);

    if (!(*tif->tif_encodestrip)(tif, (uint8_t *)data, cc, sample))
        return ((tmsize_t)-1);
    if (!(*tif->tif_postencode)(tif))
        return ((tmsize_t)-1);
    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
        TIFFReverseBits(tif->tif_rawdata, tif->tif_rawcc);
    if (tif->tif_rawcc > 0 &&
        !TIFFAppendToStrip(tif, strip, tif->tif_rawdata, tif->tif_rawcc))
        return ((tmsize_t)-1);
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
    return (cc);
}